

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

void fdb_sync_db_header(fdb_kvs_handle *handle)

{
  bool bVar1;
  __atomic_base<unsigned_long> _Var2;
  fdb_seqnum_t fVar3;
  btree_kv_ops *kv_ops;
  __atomic_base<unsigned_long> in_RDI;
  bid_t *stale_root_bid;
  char *prev_filename;
  char *compacted_filename;
  bid_t new_stale_root;
  bid_t new_seq_root;
  bid_t idtree_root;
  uint64_t version;
  uint64_t dummy64;
  uint64_t header_flags;
  filemgr_header_revnum_t revnum;
  bid_t hdr_bid;
  size_t header_len;
  void *header_buf;
  uint64_t cur_revnum;
  filemgr_header_revnum_t *in_stack_ffffffffffffff28;
  filemgr *file;
  filemgr *in_stack_ffffffffffffff30;
  filemgr *handle_00;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff38;
  filemgr *handle_01;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff40;
  uint32_t nodesize;
  void *in_stack_ffffffffffffff48;
  filemgr *in_stack_ffffffffffffff50;
  btree_blk_ops *blk_ops;
  undefined1 *header_buf_00;
  btree *btree;
  uint64_t *in_stack_ffffffffffffff70;
  uint64_t *nlivenodes;
  uint64_t *in_stack_ffffffffffffff80;
  uint64_t *in_stack_ffffffffffffff88;
  btree_blk_ops *in_stack_ffffffffffffff90;
  btree_kv_ops *in_stack_ffffffffffffff98;
  char **new_filename;
  char **in_stack_ffffffffffffffa8;
  __atomic_base<unsigned_long> local_38;
  __atomic_base<unsigned_long> local_30;
  __atomic_base<unsigned_long> local_28;
  __atomic_base<unsigned_long> local_20;
  
  local_20._M_i = in_RDI._M_i;
  local_28._M_i = filemgr_get_header_revnum(in_stack_ffffffffffffff30);
  _Var2._M_i = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff38);
  if (_Var2._M_i == local_28._M_i) {
    if (local_20._M_i == **(__int_type **)(local_20._M_i + 0x28)) {
      fVar3 = filemgr_get_seqnum((filemgr *)0x1453d1);
      *(fdb_seqnum_t *)(local_20._M_i + 0x1b0) = fVar3;
    }
  }
  else {
    local_30._M_i = 0;
    local_30._M_i =
         (__int_type)
         filemgr_get_header(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                            &in_stack_ffffffffffffff40->_M_i,&in_stack_ffffffffffffff38->_M_i,
                            (fdb_seqnum_t *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (local_38._M_i == 0) {
      filemgr_get_header_bid(in_stack_ffffffffffffff30);
      atomic_store_uint64_t
                ((atomic<unsigned_long> *)in_stack_ffffffffffffff30,
                 (uint64_t)in_stack_ffffffffffffff28,memory_order_relaxed);
    }
    else {
      nlivenodes = (uint64_t *)0x0;
      new_filename = *(char ***)(*(long *)(local_20._M_i + 0x48) + 400);
      atomic_store_uint64_t
                ((atomic<unsigned_long> *)in_stack_ffffffffffffff30,
                 (uint64_t)in_stack_ffffffffffffff28,memory_order_relaxed);
      std::__atomic_base<unsigned_long>::operator=
                (in_stack_ffffffffffffff40,(__int_type)in_stack_ffffffffffffff38);
      stale_root_bid = (bid_t *)(local_20._M_i + 0x198);
      kv_ops = (btree_kv_ops *)(local_20._M_i + 0x1a0);
      file = (filemgr *)&stack0xffffffffffffffa8;
      blk_ops = (btree_blk_ops *)&stack0xffffffffffffffb0;
      header_buf_00 = &stack0xffffffffffffff80;
      btree = (btree *)&stack0xffffffffffffff78;
      handle_00 = file;
      handle_01 = file;
      fdb_fetch_header((uint64_t)btree,header_buf_00,(bid_t *)blk_ops,(bid_t *)kv_ops,stale_root_bid
                       ,(uint64_t *)file,in_stack_ffffffffffffff70,nlivenodes,
                       in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
                       (uint64_t *)in_stack_ffffffffffffff90,(uint64_t *)in_stack_ffffffffffffff98,
                       new_filename,in_stack_ffffffffffffffa8);
      nodesize = (uint32_t)((ulong)stale_root_bid >> 0x20);
      if (*(char *)(local_20._M_i + 0x1d1) != '\0') {
        btreeblk_discard_blocks((btreeblk_handle *)handle_00);
      }
      *(btree_kv_ops **)(*(long *)(local_20._M_i + 0x30) + 8) = in_stack_ffffffffffffff98;
      if ((*(char *)(local_20._M_i + 0x90) == '\x01') &&
         (in_stack_ffffffffffffff90 != *(btree_blk_ops **)(*(long *)(local_20._M_i + 0x40) + 8))) {
        if ((*(byte *)(local_20._M_i + 0xb0) & 1) == 0) {
          btree_init_from_bid(btree,header_buf_00,blk_ops,kv_ops,nodesize,(bid_t)handle_01);
        }
        else {
          *(btree_blk_ops **)(*(long *)(local_20._M_i + 0x40) + 8) = in_stack_ffffffffffffff90;
        }
      }
      bVar1 = ver_staletree_support((filemgr_magic_t)new_filename);
      if (bVar1) {
        btree_init_from_bid(btree,header_buf_00,blk_ops,kv_ops,nodesize,(bid_t)handle_01);
        btreeblk_end((btreeblk_handle *)handle_01);
      }
      else {
        *(undefined8 *)(local_20._M_i + 0x38) = 0;
      }
      if (nlivenodes != (uint64_t *)0x0) {
        free(nlivenodes);
      }
      *(undefined1 *)(local_20._M_i + 0x1d1) = 0;
      if (*(long *)(local_20._M_i + 0x18) == 0) {
        fVar3 = filemgr_get_seqnum((filemgr *)0x145343);
        *(fdb_seqnum_t *)(local_20._M_i + 0x1b0) = fVar3;
      }
      else {
        fVar3 = fdb_kvs_get_seqnum(file,0x14531e);
        *(fdb_seqnum_t *)(local_20._M_i + 0x1b0) = fVar3;
      }
    }
    if ((void *)local_30._M_i != (void *)0x0) {
      free((void *)local_30._M_i);
    }
  }
  return;
}

Assistant:

void fdb_sync_db_header(fdb_kvs_handle *handle)
{
    uint64_t cur_revnum = filemgr_get_header_revnum(handle->file);
    if (handle->cur_header_revnum != cur_revnum) {
        void *header_buf = NULL;
        size_t header_len;
        bid_t hdr_bid;
        filemgr_header_revnum_t revnum;

        header_buf = filemgr_get_header(handle->file, NULL, &header_len,
                                        &hdr_bid, NULL, &revnum);
        if (header_len > 0) {
            uint64_t header_flags, dummy64, version;
            bid_t idtree_root;
            bid_t new_seq_root;
            bid_t new_stale_root;
            char *compacted_filename;
            char *prev_filename = NULL;

            version = handle->file->version;
            atomic_store_uint64_t(&handle->last_hdr_bid, hdr_bid);
            handle->cur_header_revnum = revnum;

            fdb_fetch_header(version, header_buf, &idtree_root,
                             &new_seq_root, &new_stale_root, &dummy64,
                             &dummy64, &dummy64,
                             &dummy64, &handle->last_wal_flush_hdr_bid,
                             &handle->kv_info_offset, &header_flags,
                             &compacted_filename, &prev_filename);

            if (handle->dirty_updates) {
                // discard all cached writable b+tree nodes
                // to avoid data inconsistency with other writers
                btreeblk_discard_blocks(handle->bhandle);
            }

            handle->trie->root_bid = idtree_root;

            if (handle->config.seqtree_opt == FDB_SEQTREE_USE) {
                if (new_seq_root != handle->seqtree->root_bid) {
                    if (handle->config.multi_kv_instances) {
                        handle->seqtrie->root_bid = new_seq_root;
                    } else {
                        btree_init_from_bid(handle->seqtree,
                                            handle->seqtree->blk_handle,
                                            handle->seqtree->blk_ops,
                                            handle->seqtree->kv_ops,
                                            handle->seqtree->blksize,
                                            new_seq_root);
                    }
                }
            }

            if (ver_staletree_support(version)) {
                btree_init_from_bid(handle->staletree,
                                    handle->staletree->blk_handle,
                                    handle->staletree->blk_ops,
                                    handle->staletree->kv_ops,
                                    handle->staletree->blksize,
                                    new_stale_root);
                btreeblk_end((struct btreeblk_handle*)
                             handle->staletree->blk_handle);
            } else {
                handle->staletree = NULL;
            }

            if (prev_filename) {
                free(prev_filename);
            }

            handle->dirty_updates = 0;
            if (handle->kvs) {
                // multiple KV instance mode AND sub handle
                handle->seqnum = fdb_kvs_get_seqnum(handle->file,
                                                    handle->kvs->id);
            } else {
                // super handle OR single KV instance mode
                handle->seqnum = filemgr_get_seqnum(handle->file);
            }
        } else {
            atomic_store_uint64_t(&handle->last_hdr_bid,
                                  filemgr_get_header_bid(handle->file));
        }

        if (header_buf) {
            free(header_buf);
        }
    } else {
        if (handle == handle->fhandle->root) {
            // MB-20091: Commits use root handle that points to default kv store
            // The same default KV Store can have a different user-level handle.
            // To ensure that the root handle which will do the commit always
            // remains updated with the latest sequence number generated by the
            // user KVS Handle, we must always update the root handle's seqnum
            // even if there are no new commit headers to sync up in the file.
            handle->seqnum = filemgr_get_seqnum(handle->file);
        }
    }
}